

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall
mp::SolverOptionManager::AddOptionSynonyms_Inline_Back
          (SolverOptionManager *this,char *names_list,char *realName)

{
  logic_error *this_00;
  char **in_RDX;
  char **in_RSI;
  CStringRef in_RDI;
  char *in_stack_00000008;
  SolverOption *in_stack_00000010;
  SolverOption *real;
  bool in_stack_0000019f;
  char *in_stack_000001a0;
  SolverOptionManager *in_stack_000001a8;
  BasicCStringRef<char> local_48;
  string local_40 [32];
  SolverOption *local_20;
  
  local_20 = FindOption(in_stack_000001a8,in_stack_000001a0,in_stack_0000019f);
  if (local_20 == (SolverOption *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    fmt::BasicCStringRef<char>::BasicCStringRef
              (&local_48,"Option {} referred to by synonyms {} is unknown");
    fmt::format<char_const*,char_const*>(in_RDI,in_RSI,in_RDX);
    std::logic_error::logic_error(this_00,local_40);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  SolverOption::add_synonyms_back(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void SolverOptionManager::AddOptionSynonyms_Inline_Back(
    const char* names_list, const char* realName)
{
  SolverOption* real = FindOption(realName);
  if (!real)
    throw std::logic_error(
        fmt::format("Option {} referred to by synonyms {} is unknown",
                    realName, names_list));
  real->add_synonyms_back(names_list);
}